

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

void Extra_PrintHexReverse(FILE *pFile,uint *pTruth,int nVars)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  fwrite("0x",2,1,(FILE *)pFile);
  uVar3 = 1 << ((byte)nVars & 0x1f);
  uVar3 = (uint)(0 < (int)(uVar3 & 0x80000003)) + (int)uVar3 / 4;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  bVar2 = 0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = pTruth[uVar4 >> 3] >> (bVar2 & 0x1f) & 0xf;
    if (uVar1 < 10) {
      fprintf((FILE *)pFile,"%d");
    }
    else {
      fputc(uVar1 + 0x37,(FILE *)pFile);
    }
    bVar2 = bVar2 + 4;
  }
  return;
}

Assistant:

void Extra_PrintHexReverse( FILE * pFile, unsigned * pTruth, int nVars )
{
    int nMints, nDigits, Digit, k;

    // write the number into the file
    fprintf( pFile, "0x" );
    nMints  = (1 << nVars);
    nDigits = nMints / 4 + ((nMints % 4) > 0);
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = ((pTruth[k/8] >> (k * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}